

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeAttributeSeams(MeshEdgebreakerTraversalDecoder *this)

{
  bool bVar1;
  long *plVar2;
  RAnsBitDecoder *pRVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)this->num_attribute_data_;
  bVar1 = true;
  if (0 < lVar5) {
    plVar2 = (long *)operator_new__(lVar5 * 0x18 + 8);
    *plVar2 = lVar5;
    lVar4 = 0;
    pRVar3 = (RAnsBitDecoder *)(plVar2 + 1);
    do {
      RAnsBitDecoder::RAnsBitDecoder(pRVar3);
      lVar4 = lVar4 + -0x18;
      pRVar3 = pRVar3 + 1;
    } while (-lVar4 != lVar5 * 0x18);
    pRVar3 = (this->attribute_connectivity_decoders_)._M_t.
             super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>
             .super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>._M_head_impl;
    (this->attribute_connectivity_decoders_)._M_t.
    super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>._M_t
    .super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>.
    super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>._M_head_impl =
         (RAnsBitDecoder *)(plVar2 + 1);
    if (pRVar3 != (RAnsBitDecoder *)0x0) {
      std::default_delete<draco::RAnsBitDecoder[]>::operator()
                ((default_delete<draco::RAnsBitDecoder[]> *)&this->attribute_connectivity_decoders_,
                 pRVar3);
    }
    if (0 < this->num_attribute_data_) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        bVar1 = RAnsBitDecoder::StartDecoding
                          ((RAnsBitDecoder *)
                           ((long)&(((this->attribute_connectivity_decoders_)._M_t.
                                     super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>
                                     .super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>.
                                    _M_head_impl)->ans_decoder_).buf + lVar5),&this->buffer_);
        if (!bVar1) {
          return bVar1;
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x18;
      } while (lVar4 < this->num_attribute_data_);
    }
  }
  return bVar1;
}

Assistant:

bool DecodeAttributeSeams() {
    // Prepare attribute decoding.
    if (num_attribute_data_ > 0) {
      attribute_connectivity_decoders_ = std::unique_ptr<BinaryDecoder[]>(
          new BinaryDecoder[num_attribute_data_]);
      for (int i = 0; i < num_attribute_data_; ++i) {
        if (!attribute_connectivity_decoders_[i].StartDecoding(&buffer_)) {
          return false;
        }
      }
    }
    return true;
  }